

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O2

void test_qclab_qgates_iSWAP<std::complex<double>>(void)

{
  pointer *this;
  undefined4 *puVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  undefined8 *puVar5;
  stringstream *psVar6;
  char *pcVar7;
  char *in_R9;
  byte bVar8;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<std::complex<double>_> __l_02;
  initializer_list<std::complex<double>_> __l_03;
  initializer_list<std::complex<double>_> __l_04;
  initializer_list<std::complex<double>_> __l_05;
  SquareMatrix<std::complex<double>_> iSWAP_check;
  AssertionResult gtest_ar_5;
  vector<int,_std::allocator<int>_> qubits;
  iSWAP<std::complex<double>_> iswap;
  iSWAP<std::complex<double>_> iswap2;
  int qnew_1 [2];
  AssertionResult gtest_ar__3;
  int qnew [2];
  AssertHelper local_450;
  SquareMatrix<std::complex<double>_> I3;
  SquareMatrix<std::complex<double>_> I1;
  stringstream qasm;
  undefined7 uStack_427;
  array<int,_2UL> aStack_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  undefined8 local_408;
  undefined1 *puStack_400;
  undefined1 *local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3a8 [128];
  undefined1 local_328 [144];
  V v4;
  V v3;
  SquareMatrix<std::complex<double>_> local_268;
  SquareMatrix<std::complex<double>_> local_258;
  SquareMatrix<std::complex<double>_> local_248;
  SquareMatrix<std::complex<double>_> local_238;
  SquareMatrix<std::complex<double>_> local_228;
  SquareMatrix<std::complex<double>_> local_218;
  SquareMatrix<std::complex<double>_> local_208;
  SquareMatrix<std::complex<double>_> local_1f8;
  SquareMatrix<std::complex<double>_> local_1e8;
  SquareMatrix<std::complex<double>_> local_1d8;
  SquareMatrix<std::complex<double>_> local_1c8;
  SquareMatrix<std::complex<double>_> local_1b8;
  SquareMatrix<std::complex<double>_> local_1a8;
  SquareMatrix<std::complex<double>_> local_198;
  SquareMatrix<std::complex<double>_> local_188;
  SquareMatrix<std::complex<double>_> local_178;
  SquareMatrix<std::complex<double>_> local_168;
  SquareMatrix<std::complex<double>_> local_158;
  SquareMatrix<std::complex<double>_> local_148;
  SquareMatrix<std::complex<double>_> local_138;
  SquareMatrix<std::complex<double>_> local_128;
  SquareMatrix<std::complex<double>_> local_118;
  SquareMatrix<std::complex<double>_> local_108;
  SquareMatrix<std::complex<double>_> local_f8;
  SquareMatrix<std::complex<double>_> local_e8;
  SquareMatrix<std::complex<double>_> local_d8;
  SquareMatrix<std::complex<double>_> local_c8;
  SquareMatrix<std::complex<double>_> local_b8;
  SquareMatrix<std::complex<double>_> local_a8;
  SquareMatrix<std::complex<double>_> local_98;
  SquareMatrix<std::complex<double>_> local_88;
  SquareMatrix<std::complex<double>_> local_78;
  SquareMatrix<std::complex<double>_> I2;
  V v2;
  SquareMatrix<std::complex<double>_> I4;
  
  bVar8 = 0;
  qclab::dense::eye<std::complex<double>>((int64_t)&I1);
  qclab::dense::eye<std::complex<double>>((int64_t)&I2);
  qclab::dense::eye<std::complex<double>>((int64_t)&I3);
  qclab::dense::eye<std::complex<double>>((int64_t)&I4);
  local_3f8 = &DAT_401c000000000000;
  uStack_3f0 = 0;
  local_408 = 0x4000000000000000;
  puStack_400 = (undefined1 *)0x0;
  local_418._M_allocated_capacity = (size_type)&DAT_4014000000000000;
  local_418._8_8_ = 0;
  _qasm = &DAT_4008000000000000;
  aStack_420._M_elems[0] = 0;
  aStack_420._M_elems[1] = 0;
  __l._M_len = 4;
  __l._M_array = (iterator)&qasm;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&v2,__l,(allocator_type *)&gtest_ar_5);
  puVar5 = &DAT_003f5610;
  psVar6 = &qasm;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar8 * -0x10 + 8;
  }
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&qasm;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&v3,__l_00,(allocator_type *)&gtest_ar_5);
  memcpy(&qasm,&DAT_003f5690,0x100);
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)&qasm;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&v4,__l_01,(allocator_type *)&gtest_ar_5);
  iswap.super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (QObject<std::complex<double>_>)&PTR_nbQubits_004d0c20;
  iswap.qubits_._M_elems[0] = 0;
  iswap.qubits_._M_elems[1] = 1;
  gtest_ar_5._0_4_ = 2;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,2);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"iswap.nbQubits()","2",(int *)&gtest_ar_5,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_420._M_elems == (_Type)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)aStack_420._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x3b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  qasm = (stringstream)0x1;
  aStack_420._M_elems[0] = 0;
  aStack_420._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  qasm = (stringstream)0x1;
  aStack_420._M_elems[0] = 0;
  aStack_420._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  gtest_ar_5._0_4_ = iswap.qubits_._M_elems[0];
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"iswap.qubit()","0",(int *)&gtest_ar_5,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_420._M_elems == (_Type)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)aStack_420._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x40,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits(&qubits,&iswap);
  gtest_ar_5._0_8_ =
       (long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  iSWAP_check.size_ = CONCAT44(iSWAP_check.size_._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&qasm,"qubits.size()","2",(unsigned_long *)&gtest_ar_5,(int *)&iSWAP_check)
  ;
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_420._M_elems == (_Type)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)aStack_420._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x44,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  gtest_ar_5._0_8_ = gtest_ar_5._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"qubits[0]","0",
             qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(int *)&gtest_ar_5);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_420._M_elems == (_Type)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)aStack_420._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x45,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  gtest_ar_5._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"qubits[1]","1",
             qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1,(int *)&gtest_ar_5);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_420._M_elems == (_Type)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)aStack_420._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x46,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  qnew = (int  [2])&DAT_500000003;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits(&iswap,qnew);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,&iswap);
  iSWAP_check.size_ = CONCAT44(iSWAP_check.size_._4_4_,3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_5,"iswap.qubits()[0]","3",(int *)_qasm,(int *)&iSWAP_check);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&qasm);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x49,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,&iswap);
  iSWAP_check.size_ = CONCAT44(iSWAP_check.size_._4_4_,5);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_5,"iswap.qubits()[1]","5",(int *)(_qasm + 4),(int *)&iSWAP_check)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&qasm);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x4a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  qnew[0] = 0;
  qnew[1] = 1;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits(&iswap,qnew);
  iSWAP_check.size_ = 4;
  qclab::dense::alloc_unique_array<std::complex<double>>((dense *)&iSWAP_check.data_,0x10);
  *(undefined8 *)
   iSWAP_check.data_._M_t.
   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
   super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x60) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x68) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x70) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x78) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x90) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x80) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x88) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x98) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xa0) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xa8) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xb0) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xb8) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xc0) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 200) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xd0) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xd8) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xe0) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xe8) = 0;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xf0) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)iSWAP_check.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xf8) = 0;
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&qasm);
  bVar2 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)&qasm,&iSWAP_check);
  gtest_ar_5.success_ = bVar2;
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &aStack_420);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&iswap2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar_5,
               (AssertionResult *)"iswap.matrix() == iSWAP_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x55,_qasm);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&iswap2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(iswap2.super_QGate2<std::complex<double>_>.
                         super_QObject<std::complex<double>_>._vptr_QObject._4_4_,
                         (int)iswap2.super_QGate2<std::complex<double>_>.
                              super_QObject<std::complex<double>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(iswap2.super_QGate2<std::complex<double>_>.
                                     super_QObject<std::complex<double>_>._vptr_QObject._4_4_,
                                     (int)iswap2.super_QGate2<std::complex<double>_>.
                                          super_QObject<std::complex<double>_>._vptr_QObject) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  qclab::qgates::QGate2<std::complex<double>_>::print(&iswap.super_QGate2<std::complex<double>_>);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  iswap2.super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject.
  _0_4_ = qclab::qgates::iSWAP<std::complex<double>_>::toQASM
                    (&iswap,(ostream *)local_418._M_local_buf,0);
  gtest_ar__3._0_8_ = (ulong)(uint)gtest_ar__3._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_5,"iswap.toQASM( qasm )","0",(int *)&iswap2,(int *)&gtest_ar__3);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&iswap2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x5c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&iswap2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    if ((long *)CONCAT44(iswap2.super_QGate2<std::complex<double>_>.
                         super_QObject<std::complex<double>_>._vptr_QObject._4_4_,
                         (int)iswap2.super_QGate2<std::complex<double>_>.
                              super_QObject<std::complex<double>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(iswap2.super_QGate2<std::complex<double>_>.
                                     super_QObject<std::complex<double>_>._vptr_QObject._4_4_,
                                     (int)iswap2.super_QGate2<std::complex<double>_>.
                                          super_QObject<std::complex<double>_>._vptr_QObject) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[19]>
            ((internal *)&iswap2,"qasm.str()","\"iswap q[0], q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_5,
             (char (*) [19])"iswap q[0], q[1];\n");
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  if ((char)iswap2.super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (iswap2.qubits_._M_elems == (_Type)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)iswap2.qubits_._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x5d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iswap2.qubits_);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&std::cout,(string *)&gtest_ar_5);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP(&iswap2,2,4);
  cVar3 = (**(code **)((long)iswap.super_QGate2<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject + 0x70))
                    (&iswap,&iswap2);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__3.success_ = (bool)cVar3;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)qnew_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5,(internal *)&gtest_ar__3,(AssertionResult *)"iswap == iswap2",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x62,(char *)gtest_ar_5._0_8_);
    testing::internal::AssertHelper::operator=(&local_450,(Message *)qnew_1);
    testing::internal::AssertHelper::~AssertHelper(&local_450);
    std::__cxx11::string::~string((string *)&gtest_ar_5);
    if (qnew_1 != (int  [2])0x0) {
      (**(code **)(*(long *)qnew_1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  gtest_ar__3.success_ =
       (bool)(**(code **)((long)iswap.super_QGate2<std::complex<double>_>.
                                super_QObject<std::complex<double>_>._vptr_QObject + 0x70))
                       (&iswap,&iswap2);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__3.success_ == false) {
    testing::Message::Message((Message *)qnew_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5,(internal *)&gtest_ar__3,(AssertionResult *)"iswap != iswap2",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,99,(char *)gtest_ar_5._0_8_);
    testing::internal::AssertHelper::operator=(&local_450,(Message *)qnew_1);
    testing::internal::AssertHelper::~AssertHelper(&local_450);
    std::__cxx11::string::~string((string *)&gtest_ar_5);
    if (qnew_1 != (int  [2])0x0) {
      (**(code **)(*(long *)qnew_1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&iSWAP_check.data_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&qubits.super__Vector_base<int,_std::allocator<int>_>);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)&gtest_ar_5,3,5);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,2);
  iswap.super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_4_
       = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"iswap.nbQubits()","2",(int *)&qubits,(int *)&iswap);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qubits);
    if (aStack_420._M_elems == (_Type)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)aStack_420._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iswap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x69,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iswap,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iswap);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  qasm = (stringstream)0x1;
  aStack_420._M_elems[0] = 0;
  aStack_420._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  qasm = (stringstream)0x1;
  aStack_420._M_elems[0] = 0;
  aStack_420._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(iSWAP<std::complex<double>_> *)&gtest_ar_5)
  ;
  iswap.super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_4_
       = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"iswap.qubits()[0]","3",(int *)_qasm,(int *)&iswap);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iswap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iswap,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iswap);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(iSWAP<std::complex<double>_> *)&gtest_ar_5)
  ;
  iswap.super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_4_
       = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"iswap.qubits()[1]","5",(int *)(_qasm + 4),(int *)&iswap);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iswap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iswap,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iswap);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  iswap.super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (QObject<std::complex<double>_>)&DAT_500000003;
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)&gtest_ar_5,(int *)&iswap);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,2);
  iSWAP_check.size_ = CONCAT44(iSWAP_check.size_._4_4_,2);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"iswap.nbQubits()","2",(int *)&qubits,(int *)&iSWAP_check);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qubits);
    if (aStack_420._M_elems == (_Type)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)aStack_420._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x74,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  qasm = (stringstream)0x1;
  aStack_420._M_elems[0] = 0;
  aStack_420._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  qasm = (stringstream)0x1;
  aStack_420._M_elems[0] = 0;
  aStack_420._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_420);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(iSWAP<std::complex<double>_> *)&gtest_ar_5)
  ;
  iSWAP_check.size_ = CONCAT44(iSWAP_check.size_._4_4_,3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"iswap.qubits()[0]","3",(int *)_qasm,(int *)&iSWAP_check);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x77,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::qgates::iSWAP<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(iSWAP<std::complex<double>_> *)&gtest_ar_5)
  ;
  iSWAP_check.size_ = CONCAT44(iSWAP_check.size_._4_4_,5);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"iswap.qubits()[1]","5",(int *)(_qasm + 4),(int *)&iSWAP_check);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x78,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP((iSWAP<std::complex<double>_> *)qnew,0,1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,&v2
            );
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,0);
  local_3f8 = &DAT_401c000000000000;
  uStack_3f0 = 0;
  local_408 = 0;
  puStack_400 = &DAT_4014000000000000;
  local_418._M_allocated_capacity = 0;
  local_418._8_8_ = 0x4000000000000000;
  _qasm = &DAT_4008000000000000;
  aStack_420._M_elems[0] = 0;
  aStack_420._M_elems[1] = 0;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&qasm;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&qubits,__l_02,
             (allocator_type *)&iswap);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&qubits);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,&v2
            );
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,ConjTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,0);
  local_3f8 = &DAT_401c000000000000;
  uStack_3f0 = 0;
  local_408 = 0;
  puStack_400 = (undefined1 *)0xc014000000000000;
  local_418._M_allocated_capacity = 0;
  local_418._8_8_ = 0xc000000000000000;
  _qasm = &DAT_4008000000000000;
  aStack_420._M_elems[0] = 0;
  aStack_420._M_elems[1] = 0;
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&qubits,&qasm);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&qubits);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,&v3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,0);
  puVar5 = &DAT_003f5810;
  psVar6 = &qasm;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar8 * -0x10 + 8;
  }
  __l_03._M_len = 8;
  __l_03._M_array = (iterator)&qasm;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iSWAP_check,
             __l_03,(allocator_type *)&iswap2);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iSWAP_check);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,&v3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,ConjTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,0);
  puVar5 = &DAT_003f5890;
  psVar6 = &qasm;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar8 * -0x10 + 8;
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&iSWAP_check,&qasm
             ,local_3a8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iSWAP_check);
  qnew_1[0] = 1;
  qnew_1[1] = 2;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits
            ((iSWAP<std::complex<double>_> *)qnew,qnew_1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,&v3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,0);
  puVar5 = &DAT_003f5910;
  psVar6 = &qasm;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar8 * -0x10 + 8;
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&iSWAP_check,&qasm
             ,local_3a8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iSWAP_check);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,&v3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,ConjTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,0);
  puVar5 = &DAT_003f5990;
  psVar6 = &qasm;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar8 * -0x10 + 8;
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&iSWAP_check,&qasm
             ,local_3a8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iSWAP_check);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,0);
  memcpy(&qasm,&DAT_003f5a10,0x100);
  __l_04._M_len = 0x10;
  __l_04._M_array = (iterator)&qasm;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar__3,
             __l_04,(allocator_type *)&local_450);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar__3);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,ConjTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,0);
  memcpy(&qasm,&DAT_003f5b10,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&gtest_ar__3,&qasm
             ,local_328);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar__3);
  qnew_1[0] = 0;
  qnew_1[1] = 1;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits
            ((iSWAP<std::complex<double>_> *)qnew,qnew_1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,0);
  memcpy(&qasm,&DAT_003f5c10,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&gtest_ar__3,&qasm
             ,local_328);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar__3);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,ConjTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,0);
  memcpy(&qasm,&DAT_003f5d10,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&gtest_ar__3,&qasm
             ,local_328);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar__3);
  qnew_1[0] = 2;
  qnew_1[1] = 3;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits
            ((iSWAP<std::complex<double>_> *)qnew,qnew_1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,0);
  memcpy(&qasm,&DAT_003f5e10,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&gtest_ar__3,&qasm
             ,local_328);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar__3);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)qnew,ConjTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,0);
  memcpy(&qasm,&DAT_003f5f10,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&gtest_ar__3,&qasm
             ,local_328);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar__3);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &gtest_ar__3);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap2);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &iSWAP_check);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&iswap);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&qubits);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &gtest_ar_5);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP(&iswap,0,2);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,&v3
            );
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            (&iswap,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,0);
  puVar5 = &DAT_003f6010;
  psVar6 = &qasm;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar8 * -0x10 + 8;
  }
  __l_05._M_len = 8;
  __l_05._M_array = (iterator)&qasm;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&qubits,__l_05,
             (allocator_type *)&iSWAP_check);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&qubits);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,&v3
            );
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            (&iswap,ConjTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,0);
  puVar5 = &DAT_003f6090;
  psVar6 = &qasm;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar8 * -0x10 + 8;
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&qubits,&qasm,
             local_3a8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&gtest_ar_5,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&qubits);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&qubits);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &gtest_ar_5);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP((iSWAP<std::complex<double>_> *)&qasm,0,1);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_5,&I2);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_5,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_78,(SquareMatrix<std::complex<double>_> *)&gtest_ar_5);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&local_88);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_78,&local_88);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_88.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_78.data_);
  this = &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_00000004;
  qclab::dense::alloc_unique_array<std::complex<double>>((dense *)this,0x10);
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish[0]
       = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish[1]
       = 0x3ff00000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish[2]
       = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish[3]
       = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   4) = &DAT_4014000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish[6]
       = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish[7]
       = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   8) = &DAT_4022000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish[10]
       = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0xb] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0xc) = &DAT_402a000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0xe] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0xf] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x10] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x11] = 0x40000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x12] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x13] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x14) = &DAT_4018000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x16] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x17] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x18) = &DAT_4024000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x1a] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x1b] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x1c) = &DAT_402c000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x1e] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x1f] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x20) = &DAT_4008000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x22] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x23] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x24) = &DAT_401c000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x26] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x27] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x28) = &DAT_4026000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x2a] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x2b] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x2c) = &DAT_402e000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x2e] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x2f] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x30) = &DAT_4010000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x32] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x33] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x34) = &DAT_4020000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x36] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x37] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x38) = &DAT_4028000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x3a] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x3b] = 0;
  *(undefined1 **)
   (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
   0x3c) = &DAT_4030000000000000;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x3e] = 0;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  [0x3f] = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_5,
             (SquareMatrix<std::complex<double>_> *)&qubits);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_5,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_98,(SquareMatrix<std::complex<double>_> *)&gtest_ar_5);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_b8,(SquareMatrix<std::complex<double>_> *)&qubits);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix(&iswap);
  qclab::dense::operator*
            ((dense *)&local_a8,&local_b8,(SquareMatrix<std::complex<double>_> *)&iswap);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_98,&local_a8);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_a8.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &iswap.qubits_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_b8.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_98.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_5,
             (SquareMatrix<std::complex<double>_> *)&qubits);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_5,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_c8,(SquareMatrix<std::complex<double>_> *)&gtest_ar_5);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&local_e8);
  qclab::dense::operator*
            ((dense *)&local_d8,&local_e8,(SquareMatrix<std::complex<double>_> *)&qubits);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_c8,&local_d8);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_d8.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_e8.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_c8.data_);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix((iSWAP<std::complex<double>_> *)&iSWAP_check);
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&iswap,&iSWAP_check);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&iSWAP_check.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_5,
             (SquareMatrix<std::complex<double>_> *)&qubits);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Left,ConjTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_5,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_f8,(SquareMatrix<std::complex<double>_> *)&gtest_ar_5);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_118,(SquareMatrix<std::complex<double>_> *)&qubits);
  qclab::dense::operator*
            ((dense *)&local_108,&local_118,(SquareMatrix<std::complex<double>_> *)&iswap);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_f8,&local_108);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_108.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_118.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_f8.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar_5,
             (SquareMatrix<std::complex<double>_> *)&qubits);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Right,ConjTrans,2,
             (SquareMatrix<std::complex<double>_> *)&gtest_ar_5,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_128,(SquareMatrix<std::complex<double>_> *)&gtest_ar_5);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_148,(SquareMatrix<std::complex<double>_> *)&iswap);
  qclab::dense::operator*
            ((dense *)&local_138,&local_148,(SquareMatrix<std::complex<double>_> *)&qubits);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_128,&local_138);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_138.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_148.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_128.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Left,NoTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_158,&iSWAP_check);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix(&iswap2);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_168,(SquareMatrix<std::complex<double>_> *)&iswap2,&I1);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_158,&local_168);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_168.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &iswap2.qubits_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_158.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Right,NoTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_178,&iSWAP_check);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix(&iswap2);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_188,(SquareMatrix<std::complex<double>_> *)&iswap2,&I1);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_178,&local_188);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_188.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &iswap2.qubits_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_178.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Left,ConjTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_198,&iSWAP_check);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1a8,(SquareMatrix<std::complex<double>_> *)&iswap,&I1);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_198,&local_1a8);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_1a8.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_198.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Right,ConjTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_1b8,&iSWAP_check);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1c8,(SquareMatrix<std::complex<double>_> *)&iswap,&I1);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1b8,&local_1c8);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_1c8.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_1b8.data_);
  gtest_ar__3.success_ = true;
  gtest_ar__3._1_7_ = 0x2000000;
  qclab::qgates::iSWAP<std::complex<double>_>::setQubits
            ((iSWAP<std::complex<double>_> *)&qasm,(int *)&gtest_ar__3);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Left,NoTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_1d8,&iSWAP_check);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix(&iswap2);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1e8,&I1,(SquareMatrix<std::complex<double>_> *)&iswap2);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1d8,&local_1e8);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_1e8.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &iswap2.qubits_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_1d8.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Right,NoTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_1f8,&iSWAP_check);
  qclab::qgates::iSWAP<std::complex<double>_>::matrix(&iswap2);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_208,&I1,(SquareMatrix<std::complex<double>_> *)&iswap2);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1f8,&local_208);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_208.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &iswap2.qubits_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_1f8.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Left,ConjTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_218,&iSWAP_check);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_228,&I1,(SquareMatrix<std::complex<double>_> *)&iswap);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_218,&local_228);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_228.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_218.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Right,ConjTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_238,&iSWAP_check);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_248,&I1,(SquareMatrix<std::complex<double>_> *)&iswap);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_238,&local_248);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_248.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_238.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&iSWAP_check.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &iswap.qubits_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             this);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &gtest_ar_5.message_);
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP((iSWAP<std::complex<double>_> *)&qasm,0,2);
  qclab::dense::zeros<std::complex<double>>((int64_t)&gtest_ar_5);
  *(undefined8 *)
   gtest_ar_5.message_._M_t.
   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   .
   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
   ._M_head_impl = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 8) = 0;
  puVar1 = (undefined4 *)
           ((long)gtest_ar_5.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x40 + gtest_ar_5._0_8_ * 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0x3ff00000;
  puVar5 = (undefined8 *)
           ((long)gtest_ar_5.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x20 + gtest_ar_5._0_8_ * 0x20);
  *puVar5 = 0x3ff0000000000000;
  puVar5[1] = 0;
  puVar1 = (undefined4 *)
           ((long)gtest_ar_5.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x60 + gtest_ar_5._0_8_ * 0x30);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0x3ff00000;
  puVar1 = (undefined4 *)
           ((long)gtest_ar_5.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x10 + gtest_ar_5._0_8_ * 0x40);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0x3ff00000;
  puVar5 = (undefined8 *)
           ((long)gtest_ar_5.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x50 + gtest_ar_5._0_8_ * 0x50);
  *puVar5 = 0x3ff0000000000000;
  puVar5[1] = 0;
  puVar1 = (undefined4 *)
           ((long)gtest_ar_5.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x30 + gtest_ar_5._0_8_ * 0x60);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0x3ff00000;
  puVar5 = (undefined8 *)
           ((long)gtest_ar_5.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x70 + gtest_ar_5._0_8_ * 0x70);
  *puVar5 = 0x3ff0000000000000;
  puVar5[1] = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&qubits,&I3);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&qasm,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)&qubits,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_258,(SquareMatrix<std::complex<double>_> *)&qubits);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_268,(SquareMatrix<std::complex<double>_> *)&gtest_ar_5);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_258,&local_268);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_268.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_258.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &gtest_ar_5.message_);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&v4.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&v3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&v2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&I4.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&I3.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&I2.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&I1.data_);
  return;
}

Assistant:

void test_qclab_qgates_iSWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::iSWAP< T >  iswap ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( iswap.qubit() , 0 ) ;

    // qubits
    auto qubits = iswap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    iswap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    iswap.setQubits( &qnew[0] ) ;

    // matrix
    const T i(0,1) ;
    qclab::dense::SquareMatrix< T >  iSWAP_check( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , i , 0 ,
                                                  0 , i , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( iswap.matrix() == iSWAP_check ) ;

    // print
    iswap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( iswap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "iswap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::iSWAP< T >  iswap2( 2 , 4 ) ;
    EXPECT_TRUE(  iswap == iswap2 ) ;
    EXPECT_FALSE( iswap != iswap2 ) ;
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 3 , 5 ) ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::iSWAP< T >  iswap( &qubits[0] ) ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    iswap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , T(0,2) , T(0,5) , 7 } ;
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { iswap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #endif
    vec2 = v2 ;
    iswap.apply( qclab::Op::ConjTrans , 2 , vec2 ) ;
    check2 = { 3 , T(0,-2) , T(0,-5) , 7 } ;
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { iswap.apply_device( qclab::Op::ConjTrans , 2 , vec2_ ) ; }
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , T(0,4) , T(0,1) , T(0,2) , T(0,7) , 8 , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , 5 , T(0,-4) , T(0,-1) , T(0,-2) , T(0,-7) , 8 , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    iswap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,2) , T(0,5) , 7 , 4 , T(0,8) , T(0,1) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,-2) , T(0,-5) , 7 , 4 , T(0,-8) , T(0,-1) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , T(0,4) , T(0,1) , T(0,2) , T(0,7) , 8 , 3 ,
                 7 , 2 , T(0,8) , T(0,9) , T(0,5) , T(0,6) , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , T(0,-4) , T(0,-1) , T(0,-2) , T(0,-7) , 8 , 3 ,
               7 , 2 , T(0,-8) , T(0,-9) , T(0,-5) , T(0,-6) , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    iswap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , T(0,7) , T(0,2) , T(0,5) , T(0,6) ,
               T(0,4) , T(0,1) , T(0,8) , T(0,3) , 8 , 9 , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , T(0,-7) , T(0,-2) , T(0,-5) , T(0,-6) ,
               T(0,-4) , T(0,-1) , T(0,-8) , T(0,-3) , 8 , 9 , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    iswap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , T(0,2) , T(0,5) , 7 , 4 , T(0,8) , T(0,1) , 3 ,
               7 , T(0,5) , T(0,2) , 6 , 8 , T(0,5) , T(0,9) , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , T(0,-2) , T(0,-5) , 7 , 4 , T(0,-8) , T(0,-1) , 3 ,
               7 , T(0,-5) , T(0,-2) , 6 , 8 , T(0,-5) , T(0,-9) , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , T(0,4) , 2 , T(0,8) , T(0,5) , 1 , T(0,7) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,-4) , 2 , T(0,-8) , T(0,-5) , 1 , T(0,-7) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , mat * iswap.matrix() ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswap.matrix() * mat ) ;

    auto iswapH = qclab::dense::conjTrans( iswap.matrix() ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , mat * iswapH ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswapH * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( iswap.matrix() , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( iswap.matrix() , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( iswapH , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( iswapH , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    iswap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( I1 , iswap.matrix() ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( I1 , iswap.matrix() ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( I1 , iswapH ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( I1 , iswapH ) ) ;
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 2 ) ;

    const T i(0,1) ;
    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = i ;
    check(2,2) = 1 ;
    check(6,3) = i ;
    check(1,4) = i ;
    check(5,5) = 1 ;
    check(3,6) = i ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , check ) ;
  }

}